

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O3

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::StoreComponentOfValueToAccessChainToScalarVar
          (InterfaceVariableScalarReplacement *this,uint32_t value_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *component_indices,
          Instruction *scalar_var,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *access_chain_indices,
          Instruction *insert_before)

{
  uint32_t component_type_id;
  uint32_t local_34;
  
  local_34 = GetPointeeTypeIdOfVar(this,scalar_var);
  if ((access_chain_indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (access_chain_indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    scalar_var = CreateAccessChainToVar
                           (this,local_34,scalar_var,access_chain_indices,insert_before,&local_34);
  }
  StoreComponentOfValueTo
            (this,local_34,value_id,component_indices,scalar_var,(uint32_t *)0x0,insert_before);
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::
    StoreComponentOfValueToAccessChainToScalarVar(
        uint32_t value_id, const std::vector<uint32_t>& component_indices,
        Instruction* scalar_var,
        const std::vector<uint32_t>& access_chain_indices,
        Instruction* insert_before) {
  uint32_t component_type_id = GetPointeeTypeIdOfVar(scalar_var);
  Instruction* ptr = scalar_var;
  if (!access_chain_indices.empty()) {
    ptr = CreateAccessChainToVar(component_type_id, scalar_var,
                                 access_chain_indices, insert_before,
                                 &component_type_id);
  }

  StoreComponentOfValueTo(component_type_id, value_id, component_indices, ptr,
                          nullptr, insert_before);
}